

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Function * __thiscall
soul::StructuralParser::parseFunctionDeclaration
          (StructuralParser *this,Context *context,Expression *returnType,Identifier name,
          Context *nameLocation,
          vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          *genericWildcards)

{
  Scope *newScope;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *this_00;
  Scope *pSVar1;
  pointer ppVar2;
  Allocator *pAVar3;
  Function *pFVar4;
  bool bVar5;
  int iVar6;
  Handle handle;
  IntrinsicType IVar7;
  Expression *pEVar8;
  undefined4 extraout_var;
  VariableDeclaration *pVVar9;
  Identifier IVar10;
  Property *pPVar11;
  Constant *pCVar12;
  Block *pBVar13;
  Annotation *annotation;
  pool_ref<soul::AST::UnqualifiedName> *w;
  pointer ppVar14;
  string_view s;
  string_view sVar15;
  bool local_109;
  Function *local_108;
  void *local_100;
  Context typeLocation;
  pool_ptr<soul::AST::Function> local_c0;
  Context local_b8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  if (returnType->kind == type) {
    iVar6 = (*(returnType->super_Statement).super_ASTObject._vptr_ASTObject[3])(returnType);
    if ((char)iVar6 != '\0') {
      iVar6 = (*(returnType->super_Statement).super_ASTObject._vptr_ASTObject[10])(returnType);
      if (iVar6 == 0) {
        Errors::functionReturnTypeCannotBeConst<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&typeLocation);
        CompileMessage::~CompileMessage((CompileMessage *)&typeLocation);
      }
    }
  }
  local_108 = allocate<soul::AST::Function,soul::AST::Context_const&>(this,context);
  newScope = &local_108->super_Scope;
  pSVar1 = this->currentScope;
  this->currentScope = newScope;
  (local_108->name).name = name.name;
  AST::Context::operator=(&local_108->nameLocation,nameLocation);
  pFVar4 = local_108;
  (local_108->returnType).object = returnType;
  std::
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  ::_M_move_assign(&local_108->genericWildcards,genericWildcards);
  if ((pFVar4->returnType).object != (Expression *)0x0) {
    pEVar8 = pool_ptr<soul::AST::Expression>::operator*(&local_108->returnType);
    recursivelyReplaceParentScope(pEVar8,newScope);
  }
  ppVar2 = (pFVar4->genericWildcards).
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar14 = (pFVar4->genericWildcards).
                 super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar2; ppVar14 = ppVar14 + 1
      ) {
    recursivelyReplaceParentScope(&ppVar14->object->super_Expression,newScope);
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
  if (!bVar5) {
    this_00 = &local_108->parameters;
    while( true ) {
      giveErrorOnExternalKeyword(this);
      getContext(&typeLocation,this);
      pEVar8 = parseType(this,functionParameter);
      iVar6 = (*(pEVar8->super_Statement).super_ASTObject._vptr_ASTObject[0xb])(pEVar8);
      if ((CONCAT44(extraout_var,iVar6) != 0) && (*(int *)(CONCAT44(extraout_var,iVar6) + 4) == 1))
      {
        Errors::parameterCannotBeVoid<>();
        AST::Context::throwError(&typeLocation,&local_68,false);
      }
      if (0x3f8 < (ulong)((long)(pFVar4->parameters).
                                super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pFVar4->parameters).
                               super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
        Errors::tooManyParameters<>();
        AST::Context::throwError(&typeLocation,&local_a0,false);
      }
      getContext(&local_b8,this);
      local_100 = (void *)0x0;
      local_109 = false;
      pVVar9 = allocate<soul::AST::VariableDeclaration,soul::AST::Context,soul::AST::Expression&,decltype(nullptr),bool>
                         (this,&local_b8,pEVar8,&local_100,&local_109);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)&local_b8);
      local_b8.location.sourceCode.object = (SourceCodeText *)pVVar9;
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
      ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
                ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
                  *)this_00,(pool_ref<soul::AST::VariableDeclaration> *)&local_b8);
      pVVar9->isFunctionParameter = true;
      IVar10 = parseIdentifier(this);
      (pVVar9->name).name = IVar10.name;
      bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
      if (bVar5) break;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3519);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)&typeLocation);
    }
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&typeLocation);
  }
  annotation = &local_108->annotation;
  parseAnnotation(this,annotation);
  pPVar11 = AST::Annotation::findProperty<char[7]>(annotation,(char (*) [7])"intrin");
  if (pPVar11 != (Property *)0x0) {
    (*(((pPVar11->value).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
              (&typeLocation);
    if (typeLocation.location.sourceCode.object != (SourceCodeText *)0x0) {
      pCVar12 = pool_ptr<soul::AST::Constant>::operator->
                          ((pool_ptr<soul::AST::Constant> *)&typeLocation);
      if ((pCVar12->value).type.category == stringLiteral) {
        pAVar3 = this->allocator;
        pCVar12 = pool_ptr<soul::AST::Constant>::operator->
                            ((pool_ptr<soul::AST::Constant> *)&typeLocation);
        handle = soul::Value::getStringLiteral(&pCVar12->value);
        sVar15 = StringDictionary::getStringForHandle(&pAVar3->stringDictionary,handle);
        s._M_str = sVar15._M_str;
        s._M_len = (size_t)s._M_str;
        IVar7 = getIntrinsicTypeFromName((soul *)sVar15._M_len,s);
        pFVar4->intrinsic = IVar7;
        if (IVar7 == none) {
          throwInternalCompilerError
                    ("f.intrinsic != IntrinsicType::none","parseFunctionDeclaration",0x436);
        }
      }
    }
  }
  bVar5 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a19e8);
  if (!bVar5) {
    local_c0.object = pFVar4;
    pBVar13 = parseBracedBlock(this,&local_c0);
    (pFVar4->block).object = pBVar13;
  }
  this->currentScope = pSVar1;
  return pFVar4;
}

Assistant:

AST::Function& parseFunctionDeclaration (const AST::Context& context, AST::Expression& returnType,
                                             Identifier name, const AST::Context& nameLocation,
                                             std::vector<pool_ref<AST::UnqualifiedName>> genericWildcards)
    {
        if (AST::isResolvedAsType (returnType) && returnType.getConstness() == AST::Constness::definitelyConst)
            throwError (Errors::functionReturnTypeCannotBeConst());

        auto& f = allocate<AST::Function> (context);
        ScopedScope scope (*this, f);

        f.name = name;
        f.nameLocation = nameLocation;
        f.returnType = returnType;
        f.genericWildcards = std::move (genericWildcards);

        if (f.returnType != nullptr)
            recursivelyReplaceParentScope (*f.returnType, f);

        for (auto& w : f.genericWildcards)
            recursivelyReplaceParentScope (w, f);

        if (! matchIf (Operator::closeParen))
        {
            for (;;)
            {
                giveErrorOnExternalKeyword();
                auto typeLocation = getContext();
                auto& type = parseType (ParseTypeContext::functionParameter);

                if (auto t = type.getConcreteType())
                    if (t->isVoid())
                        typeLocation.throwError (Errors::parameterCannotBeVoid());

                if (f.parameters.size() > 127)
                    typeLocation.throwError (Errors::tooManyParameters());

                auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
                f.parameters.push_back (v);
                v.isFunctionParameter = true;
                v.name = parseIdentifier();

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }

        parseAnnotation (f.annotation);

        if (auto intrin = f.annotation.findProperty ("intrin"))
        {
            if (auto c = intrin->value->getAsConstant())
            {
                if (c->value.getType().isStringLiteral())
                {
                    f.intrinsic = getIntrinsicTypeFromName (allocator.stringDictionary.getStringForHandle (c->value.getStringLiteral()));
                    SOUL_ASSERT (f.intrinsic != IntrinsicType::none);
                }
            }
        }

        if (! matchIf (Operator::semicolon))
            f.block = parseBracedBlock (f);

        return f;
    }